

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcxx.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"GNU GCC libstdc++");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  return 0;
}

Assistant:

int main()
{
  std::cout
#ifdef _LIBCPP_VERSION
  << "LLVM libc++"
#elif defined(_GLIBCXX_RELEASE)
  << "GNU GCC libstdc++"
#elif defined(_MSVC_STL_UPDATE)
  << "Microsoft STL"
#endif
  << " " << libcxx_release() << "\n";

  return EXIT_SUCCESS;
}